

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  pointer pbVar2;
  undefined8 this;
  _Alloc_hider _Var3;
  size_type sVar4;
  undefined4 uVar5;
  long *plVar6;
  uint uVar7;
  OptionAdder *pOVar8;
  size_t sVar9;
  ostream *poVar10;
  ulong uVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool erase_old_mdsplit_files;
  bool trace;
  bool remove_autotoc;
  bool update_links;
  bool add_front_matter;
  bool indent_headers;
  bool jekyll_escape;
  bool include_toc;
  short max_split_level;
  bool show_help;
  bool show_version;
  mdsplitter m;
  string input;
  string repository;
  string output;
  ParseResult result;
  Options options;
  bool local_bca;
  bool local_bc9;
  bool local_bc8;
  bool local_bc7;
  bool local_bc6;
  bool local_bc5;
  bool local_bc4;
  bool local_bc3;
  undefined1 local_bc2 [2];
  undefined1 local_bc0 [40];
  undefined1 local_b98 [32];
  pointer local_b78;
  undefined1 local_b69;
  undefined1 local_b68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b48;
  long local_b38 [2];
  string local_b28;
  string local_b08;
  undefined1 local_ae8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab8;
  string local_aa8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a48;
  int local_a3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a18;
  pointer local_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d8;
  undefined1 local_9c8 [16];
  undefined8 local_9b8;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined1 local_9a8 [32];
  pointer local_988;
  undefined1 local_980 [16];
  undefined1 local_970 [24];
  undefined1 local_958 [16];
  undefined1 local_948 [24];
  size_type local_930 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8 [2];
  path local_8d8;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> local_8b0;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  _Base_ptr local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_850;
  element_type *local_848;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_840;
  element_type *local_838;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_830;
  element_type *local_828;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_820;
  element_type *local_818;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_810;
  element_type *local_808;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_800;
  element_type *local_7f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7f0;
  element_type *local_7e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7e0;
  element_type *local_7d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7d0;
  element_type *local_7c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7c0;
  string local_7b8;
  long *local_798;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_790;
  long local_788 [2];
  string local_778;
  string local_758;
  long *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_730;
  long local_728 [2];
  string local_718;
  string local_6f8;
  long *local_6d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6d0;
  long local_6c8 [2];
  string local_6b8;
  string local_698;
  long *local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_670;
  long local_668 [2];
  string local_658;
  string local_638;
  long *local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_610;
  long local_608 [2];
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  shared_ptr<const_cxxopts::Value> local_478;
  shared_ptr<const_cxxopts::Value> local_468;
  shared_ptr<const_cxxopts::Value> local_458;
  shared_ptr<const_cxxopts::Value> local_448;
  shared_ptr<const_cxxopts::Value> local_438;
  shared_ptr<const_cxxopts::Value> local_428;
  shared_ptr<const_cxxopts::Value> local_418;
  shared_ptr<const_cxxopts::Value> local_408;
  shared_ptr<const_cxxopts::Value> local_3f8;
  shared_ptr<const_cxxopts::Value> local_3e8;
  shared_ptr<const_cxxopts::Value> local_3d8;
  shared_ptr<const_cxxopts::Value> local_3c8;
  shared_ptr<const_cxxopts::Value> local_3b8;
  shared_ptr<const_cxxopts::Value> local_3a8;
  shared_ptr<const_cxxopts::Value> local_398;
  long *local_380;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_378;
  long local_370 [2];
  string local_360;
  char **local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_208;
  _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1d0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_190;
  long *local_178 [2];
  long local_168 [2];
  bool *local_158;
  undefined1 local_150 [129];
  bool local_cf;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [5];
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"mdsplit","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"Generate documentation from README.md files","");
  cxxopts::Options::Options((Options *)local_150,&local_258,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"README.md","");
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"docs","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  local_9a8._24_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_980;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_9a8 + 0x18),"File","");
  uVar5 = local_980._0_4_;
  local_970._16_8_ = local_988;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9a8._24_8_ ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_980) {
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = local_980._8_4_;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = local_980._12_4_;
    local_9a8._24_8_ = &local_228;
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(local_980._4_4_,local_980._0_4_);
  local_988 = (pointer)0x0;
  local_980._0_4_ = local_980._0_4_ & 0xffffff00;
  local_970._8_8_ = local_958;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9a8._24_8_ == &local_228) {
    local_958._0_8_ = CONCAT44(local_980._4_4_,uVar5);
    local_958._12_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_958._8_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  }
  else {
    local_958._0_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_970._8_8_ = local_9a8._24_8_;
  }
  local_9a8._24_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_980;
  local_970._0_8_ = (Options *)local_150;
  local_238._0_8_ = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"i,input","");
  local_bc0._0_8_ = local_bc0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"Input file","");
  local_b68._0_8_ = &local_878;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_b98,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_b68);
  uVar1 = local_b98._0_8_;
  local_b98._0_8_ = local_b98 + 0x10;
  local_b78 = (pointer)local_b98._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"README.md","");
  (**(code **)(((_Alloc_hider *)uVar1)->_M_p + 0x50))(&local_aa8,uVar1,local_b98);
  local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_aa8._M_dataplus._M_p;
  local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8._M_string_length;
  local_aa8._M_dataplus._M_p = (pointer)0x0;
  local_aa8._M_string_length = 0;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_970,(string *)local_238,(string *)local_bc0,&local_398,
                      &local_4d8);
  local_b68._0_8_ = local_b68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"o,output","");
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b28,"Output directory","");
  local_ae8._0_8_ = &local_498;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_b48._M_local_buf,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_ae8);
  this = local_b48._8_8_;
  uVar1 = local_b48._M_allocated_capacity;
  local_b48._M_allocated_capacity = (size_type)local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"docs","");
  (**(code **)(*(long *)uVar1 + 0x50))(&local_ac8,uVar1,&local_b48);
  local_3a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ac8._M_allocated_capacity;
  local_3a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_;
  local_ac8._M_allocated_capacity = 0;
  local_ac8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,(string *)local_b68,&local_b28,&local_3a8,&local_298);
  local_ae8._0_8_ = local_ae8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"r,repository","");
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"Output repository","");
  local_9f8._0_8_ = &local_4b8;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_9b8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_898,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_9f8);
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       (undefined4)local_9b8;
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_9b8._4_4_;
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_9b0;
  local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_9ac;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  cxxopts::OptionAdder::operator()(pOVar8,(string *)local_ae8,&local_b08,&local_3b8,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_3b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_3b8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_3b8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_ae8 + 0x10)) {
    operator_delete((void *)local_ae8._0_8_,local_ae8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ac8._8_8_);
  }
  if ((long *)local_b48._M_allocated_capacity != local_b38) {
    operator_delete((void *)local_b48._M_allocated_capacity,local_b38[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b68 + 0x10)) {
    operator_delete((void *)local_b68._0_8_,local_b68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_aa8._M_string_length);
  }
  if ((pointer)local_b98._0_8_ != (pointer)(local_b98 + 0x10)) {
    operator_delete((void *)local_b98._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_b98._16_8_)->_M_p + 1));
  }
  if (local_b78 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b78);
  }
  if ((element_type *)local_bc0._0_8_ != (element_type *)(local_bc0 + 0x10)) {
    operator_delete((void *)local_bc0._0_8_,local_bc0._16_8_ + 1);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,
                    (ulong)((long)local_228.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_970._8_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_958) {
    operator_delete((void *)local_970._8_8_,(ulong)(local_958._0_8_ + 1));
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9a8._24_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_980) {
    operator_delete((void *)local_9a8._24_8_,CONCAT44(local_980._4_4_,local_980._0_4_) + 1);
  }
  local_bc2 = (undefined1  [2])0x6;
  local_a38._M_dataplus._M_p = (pointer)0x0;
  local_a38._M_string_length = 0;
  local_a38.field_2._M_allocated_capacity = 0;
  local_bc3 = false;
  local_bc4 = true;
  local_bc5 = true;
  local_bc6 = true;
  local_bc7 = true;
  local_bc8 = true;
  local_bc9 = true;
  local_bca = true;
  local_9d8._M_allocated_capacity =
       (size_type)
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"Behaviour","");
  uVar5 = local_9c8._0_4_;
  local_970._16_8_ = local_9d8._8_8_;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9d8._M_allocated_capacity ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9c8) {
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = local_9c8._8_4_;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = local_9c8._12_4_;
    local_9d8._M_allocated_capacity = (size_type)&local_228;
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(local_9c8._4_4_,local_9c8._0_4_);
  local_9d8._8_8_ = 0;
  local_9c8._0_4_ = local_9c8._0_4_ & 0xffffff00;
  local_970._0_8_ = local_150;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9d8._M_allocated_capacity == &local_228) {
    local_958._0_8_ = CONCAT44(local_9c8._4_4_,uVar5);
    local_958._12_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_958._8_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    local_970._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_958;
  }
  else {
    local_958._0_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_970._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_9d8._M_allocated_capacity;
  }
  local_238._0_8_ = &local_228;
  local_9d8._M_allocated_capacity =
       (size_type)
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"l,level","");
  local_bc0._0_8_ = (element_type *)(local_bc0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"Max level for which we should split the file","");
  local_b68._0_8_ = local_bc2;
  std::__shared_ptr<cxxopts::values::standard_value<short>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<short>>,short*>
            ((__shared_ptr<cxxopts::values::standard_value<short>,(__gnu_cxx::_Lock_policy)2> *)
             local_b98,(allocator<cxxopts::values::standard_value<short>_> *)&local_b28,
             (short **)local_b68);
  uVar1 = local_b98._0_8_;
  local_b98._0_8_ = local_b98 + 0x10;
  local_b78 = (pointer)local_b98._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"6","");
  (**(code **)(((_Alloc_hider *)uVar1)->_M_p + 0x50))(&local_7c8,uVar1,local_b98);
  local_3c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7c8;
  local_3c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_7c0;
  local_7c8 = (element_type *)0x0;
  p_Stack_7c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_970,(string *)local_238,(string *)local_bc0,&local_3c8,
                      &local_4f8);
  local_b68._0_8_ = local_b68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"c,clear-html","");
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b28,"List of HTML tags mdsplit should clear","");
  local_ae8._0_8_ = &local_a38;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)local_b48._M_local_buf,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_b08,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_ae8);
  uVar1 = local_b48._M_allocated_capacity;
  local_a48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_;
  local_b48._M_allocated_capacity = (size_type)local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"details,summary","");
  (**(code **)(*(long *)uVar1 + 0x50))(&local_7d8,uVar1,&local_b48);
  local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7d8;
  local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_7d0;
  local_7d8 = (element_type *)0x0;
  p_Stack_7d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,(string *)local_b68,&local_b28,&local_3d8,&local_518);
  local_ae8._0_8_ = local_ae8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"t,toc","");
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b08,"Create a table of contents for the new files","");
  local_aa8._M_dataplus._M_p = &local_bc3;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_9b8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_ac8,
             (bool **)&local_aa8);
  pbVar2 = local_9b8;
  local_9b8 = (pointer)local_9a8;
  local_a50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_9ac,uStack_9b0);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"false","");
  (**(code **)((pbVar2->_M_dataplus)._M_p + 0x50))(&local_7e8,pbVar2,&local_9b8);
  local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7e8;
  local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_7e0;
  local_7e8 = (element_type *)0x0;
  p_Stack_7e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,(string *)local_ae8,&local_b08,&local_3e8,&local_538);
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_aa8,"e,erase-old-mdsplit-files","");
  local_ac8._M_allocated_capacity = (size_type)&local_ab8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,"Erase old md files also generated with mdsplit","");
  local_898._M_dataplus._M_p = &local_bca;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             local_9f8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_5f8,
             (bool **)&local_898);
  uVar1 = local_9f8._0_8_;
  local_9f8._0_8_ = local_9f8 + 0x10;
  local_a58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f8._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"true","");
  (**(code **)(*(long *)uVar1 + 0x50))(&local_7f8,uVar1,local_9f8);
  local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7f8;
  local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_7f0;
  local_7f8 = (element_type *)0x0;
  p_Stack_7f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&local_aa8,(string *)&local_ac8,&local_3f8,&local_558);
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"j,jekyll-escape","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,"Escape consecutive \"{{\"s for Jekyll processing","");
  local_638._M_dataplus._M_p = &local_bc4;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_618,(allocator<cxxopts::values::standard_value<bool>_> *)&local_658,
             (bool **)&local_638);
  plVar6 = local_618;
  local_618 = local_608;
  local_a60 = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_808,plVar6,&local_618);
  local_408.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_808;
  local_408.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_800;
  local_808 = (element_type *)0x0;
  p_Stack_800 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_898,&local_5f8,&local_408,&local_578);
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"header-reindent","");
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_658,"Reindent headers to match the new files","");
  local_698._M_dataplus._M_p = &local_bc5;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_678,(allocator<cxxopts::values::standard_value<bool>_> *)&local_6b8,
             (bool **)&local_698);
  plVar6 = local_678;
  local_678 = local_668;
  local_a68 = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_818,plVar6,&local_678);
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_818;
  local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_810;
  local_818 = (element_type *)0x0;
  p_Stack_810 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_638,&local_658,&local_418,&local_598);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"f,front-matter","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"Include a front-matter in the new files","");
  local_6f8._M_dataplus._M_p = &local_bc6;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_718,
             (bool **)&local_6f8);
  plVar6 = local_6d8;
  local_6d8 = local_6c8;
  local_a70 = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_828,plVar6,&local_6d8);
  local_428.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_828;
  local_428.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_820;
  local_828 = (element_type *)0x0;
  p_Stack_820 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_698,&local_6b8,&local_428,&local_5b8);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"u,url-update","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,"Update relative URLs to their new relative paths","");
  local_758._M_dataplus._M_p = &local_bc7;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_738,(allocator<cxxopts::values::standard_value<bool>_> *)&local_778,
             (bool **)&local_758);
  plVar6 = local_738;
  local_738 = local_728;
  local_a78 = local_730;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_838,plVar6,&local_738);
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_838;
  local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_830;
  local_838 = (element_type *)0x0;
  p_Stack_830 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_6f8,&local_718,&local_438,&local_5d8);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"remove-auto-toc","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_778,"Remove automatic table of contents","");
  local_360._M_dataplus._M_p = &local_bc8;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_798,(allocator<cxxopts::values::standard_value<bool>_> *)&local_7b8,
             (bool **)&local_360);
  plVar6 = local_798;
  local_798 = local_788;
  local_a80 = local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_848,plVar6,&local_798);
  local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_848;
  local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_840;
  local_848 = (element_type *)0x0;
  p_Stack_840 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_758,&local_778,&local_448,&local_2d8);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"trace","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"Trace commands","");
  local_158 = &local_bc9;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_380,(allocator<cxxopts::values::standard_value<bool>_> *)&local_b69,&local_158);
  plVar6 = local_380;
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"true","");
  (**(code **)(*plVar6 + 0x50))(&local_858,plVar6,&local_380);
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_858;
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_850;
  local_858 = (_Base_ptr)0x0;
  p_Stack_850 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  cxxopts::OptionAdder::operator()(pOVar8,&local_360,&local_7b8,&local_458,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_850);
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if (local_378 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_378);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = local_b78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_448.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_840);
  }
  if (local_798 != local_788) {
    operator_delete(local_798,local_788[0] + 1);
  }
  if (local_a80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if (local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_830 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_830);
  }
  if (local_738 != local_728) {
    operator_delete(local_738,local_728[0] + 1);
  }
  if (local_a78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if (local_428.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_428.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_820 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_820);
  }
  if (local_6d8 != local_6c8) {
    operator_delete(local_6d8,local_6c8[0] + 1);
  }
  if (local_a70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_418.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_810 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_810);
  }
  if (local_678 != local_668) {
    operator_delete(local_678,local_668[0] + 1);
  }
  if (local_a68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if (local_408.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_800 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_800);
  }
  if (local_618 != local_608) {
    operator_delete(local_618,local_608[0] + 1);
  }
  if (local_a60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_7f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7f0);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_9f8 + 0x10)) {
    operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
  }
  if (local_a58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_allocated_capacity != &local_ab8) {
    operator_delete((void *)local_ac8._M_allocated_capacity,local_ab8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_7e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7e0);
  }
  if (local_9b8 != (pointer)local_9a8) {
    operator_delete(local_9b8,(ulong)(local_9a8._0_8_ + 1));
  }
  if (local_a50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ae8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_ae8 + 0x10)) {
    operator_delete((void *)local_ae8._0_8_,local_ae8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_7d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7d0);
  }
  if ((long *)local_b48._M_allocated_capacity != local_b38) {
    operator_delete((void *)local_b48._M_allocated_capacity,local_b38[0] + 1);
  }
  if (local_a48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b68 + 0x10)) {
    operator_delete((void *)local_b68._0_8_,local_b68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if (local_3c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_7c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7c0);
  }
  if ((pointer)local_b98._0_8_ != (pointer)(local_b98 + 0x10)) {
    operator_delete((void *)local_b98._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_b98._16_8_)->_M_p + 1));
  }
  if (pbVar2 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar2);
  }
  if ((element_type *)local_bc0._0_8_ != (element_type *)(local_bc0 + 0x10)) {
    operator_delete((void *)local_bc0._0_8_,local_bc0._16_8_ + 1);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,
                    (ulong)((long)local_228.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_970._8_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_958) {
    operator_delete((void *)local_970._8_8_,(ulong)(local_958._0_8_ + 1));
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9d8._M_allocated_capacity !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_9c8) {
    operator_delete((void *)local_9d8._M_allocated_capacity,
                    CONCAT44(local_9c8._4_4_,local_9c8._0_4_) + 1);
  }
  local_ac8._M_local_buf[0] = 1;
  local_9f8._0_8_ = local_9f8._0_8_ & 0xffffffffffffff00;
  local_a18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"Help","");
  uVar5 = local_a08._0_4_;
  local_970._16_8_ = local_a10;
  if (local_a18 ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_a08) {
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = local_a08._8_4_;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = local_a08._12_4_;
    local_a18 = &local_228;
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(local_a08._4_4_,local_a08._0_4_);
  local_a10 = (pointer)0x0;
  local_a08._0_4_ = local_a08._0_4_ & 0xffffff00;
  local_970._0_8_ = local_150;
  if (local_a18 == &local_228) {
    local_958._0_8_ = CONCAT44(local_a08._4_4_,uVar5);
    local_958._12_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_958._8_4_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    local_970._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_958;
  }
  else {
    local_958._0_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_970._8_8_ = local_a18;
  }
  local_a18 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a08;
  local_238._0_8_ = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"h,help","");
  local_bc0._0_8_ = (element_type *)(local_bc0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"Print usage","");
  local_b68._0_8_ = &local_ac8;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             local_b98,(allocator<cxxopts::values::standard_value<bool>_> *)&local_b28,
             (bool **)local_b68);
  uVar1 = local_b98._0_8_;
  local_b98._0_8_ = local_b98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"false","");
  (**(code **)(((_Alloc_hider *)uVar1)->_M_p + 0x50))(local_ae8,uVar1,local_b98);
  local_468.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_ae8._0_8_;
  local_468.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_;
  local_ae8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_ae8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_970,(string *)local_238,(string *)local_bc0,&local_468,
                      &local_318);
  local_b68._0_8_ = local_b68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"v,version","");
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b28,"Print version","");
  local_9b8 = (pointer)local_9f8;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             local_b48._M_local_buf,(allocator<cxxopts::values::standard_value<bool>_> *)&local_aa8,
             (bool **)&local_9b8);
  uVar1 = local_b48._M_allocated_capacity;
  local_b48._M_allocated_capacity = (size_type)local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"false","");
  (**(code **)(*(long *)uVar1 + 0x50))(&local_b08,uVar1,&local_b48);
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b08._M_dataplus._M_p;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b08._M_string_length;
  local_b08._M_dataplus._M_p = (pointer)0x0;
  local_b08._M_string_length = 0;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  cxxopts::OptionAdder::operator()(pOVar8,(string *)local_b68,&local_b28,&local_478,&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b08._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b08._M_string_length);
  }
  if ((long *)local_b48._M_allocated_capacity != local_b38) {
    operator_delete((void *)local_b48._M_allocated_capacity,local_b38[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b68 + 0x10)) {
    operator_delete((void *)local_b68._0_8_,local_b68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_468.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_);
  }
  if ((pointer)local_b98._0_8_ != (pointer)(local_b98 + 0x10)) {
    operator_delete((void *)local_b98._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_b98._16_8_)->_M_p + 1));
  }
  if ((pointer)local_b98._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b98._8_8_);
  }
  if ((element_type *)local_bc0._0_8_ != (element_type *)(local_bc0 + 0x10)) {
    operator_delete((void *)local_bc0._0_8_,local_bc0._16_8_ + 1);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,
                    (ulong)((long)local_228.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_970._8_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_958) {
    operator_delete((void *)local_970._8_8_,(ulong)(local_958._0_8_ + 1));
  }
  if (local_a18 !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_a08) {
    operator_delete(local_a18,CONCAT44(local_a08._4_4_,local_a08._0_4_) + 1);
  }
  local_bc0._0_8_ = local_c8;
  local_bc0._8_8_ = local_c0._M_pi;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_970,local_b8);
  cxxopts::ParseResult::ParseResult
            ((ParseResult *)local_238,
             (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>_>
              *)local_bc0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_970,local_cf,&local_a3c,&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_970);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_bc0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_bc0._8_8_);
  }
  if (local_878._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Please provide an input file",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  if (local_ac8._M_local_buf[0] == '\0') {
    local_970._0_8_ = (Options *)(local_970 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_970,"help","");
    sVar9 = cxxopts::ParseResult::count((ParseResult *)local_238,(string *)local_970);
    if ((Options *)local_970._0_8_ != (Options *)(local_970 + 0x10)) {
      operator_delete((void *)local_970._0_8_,(ulong)(local_970._16_8_ + 1));
    }
    if (sVar9 == 0) {
      if (local_9f8[0] ==
          (__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>)0x1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"mdsplit: version 0.0.1",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        uVar7 = 0;
        std::ostream::flush();
      }
      else {
        mdsplit::mdsplitter::mdsplitter((mdsplitter *)local_970);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)local_bc0,&local_878,auto_format);
        mdsplit::mdsplitter::input((mdsplitter *)local_970,(path *)local_bc0);
        std::filesystem::__cxx11::path::~path((path *)local_bc0);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)local_bc0,&local_498,auto_format);
        mdsplit::mdsplitter::output_dir((mdsplitter *)local_970,(path *)local_bc0);
        std::filesystem::__cxx11::path::~path((path *)local_bc0);
        mdsplit::mdsplitter::repository((mdsplitter *)local_970,&local_4b8);
        mdsplit::mdsplitter::max_split_level((mdsplitter *)local_970,(short)local_bc2);
        sVar4 = local_a38._M_string_length;
        _Var3._M_p = local_a38._M_dataplus._M_p;
        if (local_a38._M_dataplus._M_p != (pointer)local_a38._M_string_length) {
          uVar11 = (long)(local_a38._M_string_length - (long)local_a38._M_dataplus._M_p) >> 5;
          lVar12 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_a38._M_dataplus._M_p,local_a38._M_string_length,
                     ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (_Var3._M_p,sVar4);
        }
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (local_a38._M_dataplus._M_p,local_a38._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a38,(iterator)__first._M_current,(iterator)local_a38._M_string_length);
        mdsplit::mdsplitter::clear_html_tags
                  ((mdsplitter *)local_970,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a38);
        mdsplit::mdsplitter::include_toc((mdsplitter *)local_970,local_bc3);
        mdsplit::mdsplitter::jekyll_escape((mdsplitter *)local_970,local_bc4);
        mdsplit::mdsplitter::indent_headers((mdsplitter *)local_970,local_bc5);
        mdsplit::mdsplitter::add_front_matter((mdsplitter *)local_970,local_bc6);
        mdsplit::mdsplitter::update_links((mdsplitter *)local_970,local_bc7);
        mdsplit::mdsplitter::remove_autotoc((mdsplitter *)local_970,local_bc8);
        mdsplit::mdsplitter::trace((mdsplitter *)local_970,local_bc9);
        mdsplit::mdsplitter::erase_old_mdsplit_files((mdsplitter *)local_970,local_bca);
        uVar7 = mdsplit::mdsplitter::run((mdsplitter *)local_970);
        std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::~vector(&local_8b0);
        std::filesystem::__cxx11::path::~path(&local_8d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920.field_2._8_8_ != local_8f8) {
          operator_delete((void *)local_920.field_2._8_8_,local_8f8[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_920);
        std::filesystem::__cxx11::path::~path((path *)local_948);
        std::filesystem::__cxx11::path::~path((path *)local_970);
      }
      goto LAB_0010a154;
    }
  }
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"-i input_directory -o output_directory -r username/repository","")
  ;
  std::__cxx11::string::operator=((string *)(local_150 + 0x40),(string *)local_178);
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  local_970._0_8_ = local_970 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_970,"File","");
  local_958._8_8_ = (long)&((path *)local_948)->_M_pathname + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_958 + 8),"Behaviour","");
  pbVar13 = &local_920;
  local_930[0] = (size_type)pbVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)local_948 + 0x18),"Help","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_970;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b98,__l,(allocator_type *)local_b68);
  cxxopts::Options::help
            ((string *)local_bc0,(Options *)local_150,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b98);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_bc0._0_8_,local_bc0._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((element_type *)local_bc0._0_8_ != (element_type *)(local_bc0 + 0x10)) {
    operator_delete((void *)local_bc0._0_8_,local_bc0._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b98);
  lVar12 = -0x60;
  do {
    if (pbVar13 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar13[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar13[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar13->_M_dataplus)._M_p + 1));
    }
    pbVar13 = pbVar13 + -1;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  uVar7 = (uint)(local_878._M_string_length == 0);
LAB_0010a154:
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_190);
  std::
  _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1d0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,
                    CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                             local_4b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  cxxopts::Options::~Options((Options *)local_150);
  return uVar7;
}

Assistant:

int main(int argc, char *argv[]) {
    ///////////////////////////////////////////////////////
    /// Define command line options                     ///
    ///////////////////////////////////////////////////////
    cxxopts::Options options("mdsplit",
                             "Generate documentation from README.md files");
    std::string input = "README.md";
    std::string output = "docs";
    std::string repository;
    options.add_options("File")(
        "i,input", "Input file",
        cxxopts::value(input)->default_value("README.md"))(
        "o,output", "Output directory",
        cxxopts::value(output)->default_value("docs"))(
        "r,repository", "Output repository", cxxopts::value(repository));

    short max_split_level{6};
    std::vector<std::string> clear_html_tags{};
    bool include_toc{false};
    bool jekyll_escape{true};
    bool indent_headers{true};
    bool add_front_matter{true};
    bool update_links{true};
    bool remove_autotoc{true};
    bool trace{true};
    bool erase_old_mdsplit_files{true};
    options.add_options("Behaviour")(
        "l,level", "Max level for which we should split the file",
        cxxopts::value(max_split_level)->default_value("6"))(
        "c,clear-html", "List of HTML tags mdsplit should clear",
        cxxopts::value(clear_html_tags)->default_value("details,summary"))(
        "t,toc", "Create a table of contents for the new files",
        cxxopts::value(include_toc)->default_value("false"))(
        "e,erase-old-mdsplit-files",
        "Erase old md files also generated with mdsplit",
        cxxopts::value(erase_old_mdsplit_files)->default_value("true"))(
        "j,jekyll-escape", "Escape consecutive \"{{\"s for Jekyll processing",
        cxxopts::value(jekyll_escape)->default_value("true"))(
        "header-reindent", "Reindent headers to match the new files",
        cxxopts::value(indent_headers)->default_value("true"))(
        "f,front-matter", "Include a front-matter in the new files",
        cxxopts::value(add_front_matter)->default_value("true"))(
        "u,url-update", "Update relative URLs to their new relative paths",
        cxxopts::value(update_links)->default_value("true"))(
        "remove-auto-toc", "Remove automatic table of contents",
        cxxopts::value(remove_autotoc)->default_value("true"))(
        "trace", "Trace commands",
        cxxopts::value(trace)->default_value("true"));

    bool show_help{true};
    bool show_version{false};
    options.add_options("Help")(
        "h,help", "Print usage",
        cxxopts::value(show_help)->default_value("false"))(
        "v,version", "Print version",
        cxxopts::value(show_version)->default_value("false"));

    ///////////////////////////////////////////////////////
    /// Parse command line options                      ///
    ///////////////////////////////////////////////////////
    auto result = options.parse(argc, argv);

    if (input.empty()) {
        std::cerr << "Please provide an input file" << std::endl;
    }

    if (show_help || result.count("help")) {
        options.custom_help(
            "-i input_directory -o output_directory -r username/repository");
        std::cout << options.help({"File", "Behaviour", "Help"}) << std::endl;
        return input.empty() ? 1 : 0;
    }

    // Show version
    if (show_version) {
        std::cout << "mdsplit: version 0.0.1" << std::endl;
        return 0;
    }

    ///////////////////////////////////////////////////////
    /// Run                                             ///
    ///////////////////////////////////////////////////////
    mdsplit::mdsplitter m;
    m.input(input);
    m.output_dir(output);
    m.repository(repository);
    m.max_split_level(max_split_level);
    std::sort(clear_html_tags.begin(), clear_html_tags.end());
    clear_html_tags.erase(
        std::unique(clear_html_tags.begin(), clear_html_tags.end()),
        clear_html_tags.end());
    m.clear_html_tags(clear_html_tags);
    m.include_toc(include_toc);
    m.jekyll_escape(jekyll_escape);
    m.indent_headers(indent_headers);
    m.add_front_matter(add_front_matter);
    m.update_links(update_links);
    m.remove_autotoc(remove_autotoc);
    m.trace(trace);
    m.erase_old_mdsplit_files(erase_old_mdsplit_files);
    return m.run();
}